

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_witness_stack_free(wally_tx_witness_stack *stack,_Bool free_parent)

{
  wally_tx_witness_item *p;
  void *p_00;
  int in_EAX;
  int extraout_EAX;
  long lVar1;
  ulong uVar2;
  
  if (stack != (wally_tx_witness_stack *)0x0) {
    if (stack->items != (wally_tx_witness_item *)0x0) {
      lVar1 = 8;
      uVar2 = 0;
      while( true ) {
        p = stack->items;
        if (stack->num_items <= uVar2) break;
        p_00 = *(void **)((long)p + lVar1 + -8);
        if (p_00 != (void *)0x0) {
          clear_and_free(p_00,*(size_t *)((long)&p->witness + lVar1));
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      }
      clear_and_free(p,stack->num_items << 4);
    }
    wally_clear(stack,0x18);
    wally_free(stack);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int tx_witness_stack_free(struct wally_tx_witness_stack *stack,
                                 bool free_parent)
{
    size_t i;

    if (stack) {
        if (stack->items) {
            for (i = 0; i < stack->num_items; ++i) {
                if (stack->items[i].witness)
                    clear_and_free(stack->items[i].witness,
                                   stack->items[i].witness_len);
            }
            clear_and_free(stack->items, stack->num_items * sizeof(*stack->items));
        }
        wally_clear(stack, sizeof(*stack));
        if (free_parent)
            wally_free(stack);
    }
    return WALLY_OK;
}